

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O0

uint64_t qDecodeBitfield(QMyField *f,char *outField)

{
  uint64_t tmp;
  unsigned_long i;
  uint64_t val;
  unsigned_long numBytes;
  char *outField_local;
  QMyField *f_local;
  
  val = 0;
  for (i = 0; i < f->myField->length + 7 >> 3 && outField != (char *)0x0; i = i + 1) {
    val = (ulong)(byte)outField[i] | val << 8;
  }
  return val;
}

Assistant:

static inline uint64_t
qDecodeBitfield(const QMYSQLResultPrivate::QMyField &f, const char *outField)
{
    // byte-aligned length
    const auto numBytes = (f.myField->length + 7) / 8;
    uint64_t val = 0;
    for (unsigned long i = 0; i < numBytes && outField; ++i) {
        uint64_t tmp = static_cast<uint8_t>(outField[i]);
        val <<= 8;
        val |= tmp;
    }
    return val;
}